

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCstr * lex_str(LexState *ls)

{
  GCstr *pGVar1;
  long in_RDI;
  GCstr *s;
  LexToken in_stack_ffffffffffffffec;
  LexState *in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x24) != 0x11f) {
    err_token(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  }
  pGVar1 = (GCstr *)(ulong)*(uint *)(in_RDI + 0x10);
  lj_lex_next((LexState *)0x12be4d);
  return pGVar1;
}

Assistant:

static GCstr *lex_str(LexState *ls)
{
  GCstr *s;
  if (ls->token != TK_name && (LJ_52 || ls->token != TK_goto))
    err_token(ls, TK_name);
  s = strV(&ls->tokenval);
  lj_lex_next(ls);
  return s;
}